

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O3

QString * __thiscall
QTzTimeZonePrivate::abbreviation
          (QString *__return_storage_ptr__,QTzTimeZonePrivate *this,qint64 atMSecsSinceEpoch)

{
  long in_FS_OFFSET;
  Data local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  data(&local_48,this,atMSecsSinceEpoch);
  *(undefined4 *)&(__return_storage_ptr__->d).d = local_48.abbreviation.d.d._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_48.abbreviation.d.d._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_48.abbreviation.d.ptr._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_48.abbreviation.d.ptr._4_4_;
  (__return_storage_ptr__->d).size = local_48.abbreviation.d.size;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QTzTimeZonePrivate::abbreviation(qint64 atMSecsSinceEpoch) const
{
    return data(atMSecsSinceEpoch).abbreviation;
}